

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

NodeTraversalSignal FindDescendant_cb(TidyDocImpl *doc,Node *node,void *propagate)

{
  ctmbstr s1;
  TidyTagId TVar1;
  int iVar2;
  
  TVar1 = TidyTag_UNKNOWN;
  if ((node != (Node *)0x0) && (TVar1 = TidyTag_UNKNOWN, node->tag != (Dict *)0x0)) {
    TVar1 = node->tag->id;
  }
  if ((TVar1 == *(TidyTagId *)((long)propagate + 0x10)) &&
     ((TVar1 != TidyTag_UNKNOWN ||
      ((((node->element != (ctmbstr)0x0 && (*(long *)((long)propagate + 0x18) != 0)) &&
        (s1 = *(ctmbstr *)(*(long *)((long)propagate + 0x18) + 0x40), s1 != (ctmbstr)0x0)) &&
       (iVar2 = prvTidytmbstrcmp(s1,node->element), iVar2 == 0)))))) {
    *(Node **)propagate = node;
    return ExitTraversal;
  }
  if ((*(undefined4 **)((long)propagate + 8) != (undefined4 *)0x0) &&
     (*(Node **)((long)propagate + 0x20) == node)) {
    **(undefined4 **)((long)propagate + 8) = 1;
  }
  return VisitParent;
}

Assistant:

static NodeTraversalSignal FindDescendant_cb(TidyDocImpl* ARG_UNUSED(doc), Node* node, void *propagate)
{
    struct MatchingDescendantData *cb_data = (struct MatchingDescendantData *)propagate;

    if (TagId(node) == cb_data->matching_tagId)
    {
        /* make sure we match up 'unknown' tags exactly! */
        if (cb_data->matching_tagId != TidyTag_UNKNOWN ||
            (node->element != NULL &&
            cb_data->node_to_find != NULL &&
            cb_data->node_to_find->element != NULL &&
            0 == TY_(tmbstrcmp)(cb_data->node_to_find->element, node->element)))
        {
            cb_data->found_node = node;
            return ExitTraversal;
        }
    }

    if (cb_data->passed_marker_node && node == cb_data->marker_node)
        *cb_data->passed_marker_node = yes;

    return VisitParent;
}